

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsUtil.h
# Opt level: O0

void __thiscall FileTree::FileTree(FileTree *this)

{
  TreeNode *this_00;
  allocator local_31;
  string local_30 [32];
  FileTree *local_10;
  FileTree *this_local;
  
  this->root = (TreeNode *)0x0;
  local_10 = this;
  this_00 = (TreeNode *)operator_new(0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"/",&local_31);
  TreeNode::TreeNode(this_00,(string *)local_30,false);
  this->root = this_00;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

FileTree()
    {
        root = new TreeNode("/", false);
    }